

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

lock_guard<std::mutex> * __thiscall rcg::Device::getSerialNumber_abi_cxx11_(Device *this)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  DEVICE_INFO_CMD in_stack_0000045c;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000460;
  Device *in_stack_00000468;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  (anonymous_namespace)::cDevGetInfo_abi_cxx11_
            (in_stack_00000468,in_stack_00000460,in_stack_0000045c);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11caea);
  return in_RDI;
}

Assistant:

std::string Device::getSerialNumber()
{
  std::lock_guard<std::mutex> lock(mtx);
  return cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_SERIAL_NUMBER);
}